

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

void __thiscall
Inline::InsertOneInlinee
          (Inline *this,Instr *callInstr,RegOpnd *returnValueOpnd,Opnd *methodOpnd,
          FunctionJITTimeInfo *inlineeJITData,FunctionJITRuntimeInfo *inlineeRuntimeData,
          LabelInstr *doneLabel,StackSym *symCallerThis,bool fixedFunctionSafeThis,
          uint recursiveInlineDepth)

{
  code *pcVar1;
  bool bVar2;
  ArgSlot actualCount;
  ArgSlot AVar3;
  RegSlot returnRegSlot;
  RegOpnd *dstOpnd;
  Instr *this_00;
  JITTimeFunctionBody *funcBody;
  Func *inlinee;
  ProfiledInstr *pPVar4;
  undefined4 *puVar5;
  Instr *pIVar6;
  Instr *instr;
  IntConstOpnd *newSrc;
  BranchInstr *pBVar7;
  Opnd *functionObject;
  Instr *pIStack_f8;
  Instr *argOuts [15];
  bool local_31 [8];
  bool stackArgsArgOutExpanded;
  
  bVar2 = FunctionJITTimeInfo::IsInlined(inlineeJITData);
  if (bVar2) {
    dstOpnd = IR::RegOpnd::New(TyVar,callInstr->m_func);
    this_00 = IR::Instr::New(InlineeStart,&dstOpnd->super_Opnd,methodOpnd,callInstr->m_func);
  }
  else {
    this_00 = IR::Instr::New(callInstr->m_opcode,callInstr->m_func);
    IR::Instr::SetByteCodeOffset(this_00,callInstr);
    IR::Instr::SetSrc1(this_00,methodOpnd);
    if (returnValueOpnd != (RegOpnd *)0x0) {
      IR::Instr::SetDst(this_00,&returnValueOpnd->super_Opnd);
    }
  }
  this_00->field_0x38 = this_00->field_0x38 | 8;
  pIVar6 = callInstr;
  IR::Instr::InsertBefore(callInstr,this_00);
  CloneCallSequence((Inline *)pIVar6,callInstr,this_00);
  if (bVar2) {
    funcBody = FunctionJITTimeInfo::GetBody(inlineeJITData);
    if (returnValueOpnd == (RegOpnd *)0x0) {
      returnRegSlot = 0xffffffff;
    }
    else {
      returnRegSlot = StackSym::GetByteCodeRegSlot(returnValueOpnd->m_sym);
    }
    inlinee = BuildInlinee(this,funcBody,inlineeJITData,inlineeRuntimeData,returnRegSlot,callInstr,
                           recursiveInlineDepth);
    argOuts[0xd] = (Instr *)0xfefefefefefefefe;
    argOuts[0xb] = (Instr *)0xfefefefefefefefe;
    argOuts[0xc] = (Instr *)0xfefefefefefefefe;
    argOuts[9] = (Instr *)0xfefefefefefefefe;
    argOuts[10] = (Instr *)0xfefefefefefefefe;
    argOuts[7] = (Instr *)0xfefefefefefefefe;
    argOuts[8] = (Instr *)0xfefefefefefefefe;
    argOuts[5] = (Instr *)0xfefefefefefefefe;
    argOuts[6] = (Instr *)0xfefefefefefefefe;
    argOuts[3] = (Instr *)0xfefefefefefefefe;
    argOuts[4] = (Instr *)0xfefefefefefefefe;
    argOuts[1] = (Instr *)0xfefefefefefefefe;
    argOuts[2] = (Instr *)0xfefefefefefefefe;
    pIStack_f8 = (Instr *)0xfefefefefefefefe;
    argOuts[0] = (Instr *)0xfefefefefefefefe;
    local_31[0] = false;
    pPVar4 = IR::Instr::AsProfiledInstr(callInstr);
    actualCount = MapActuals(this,this_00,&pIStack_f8,0xf,inlinee,(pPVar4->u).field_3.fldInfoData.f1
                             ,local_31,(Instr **)0x0,0xf);
    if (actualCount == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x54e,"(actualCount > 0)","actualCount > 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    AVar3 = JITTimeFunctionBody::GetInParamsCount(funcBody);
    functionObject = (Opnd *)(ulong)(uint)actualCount;
    MapFormals(this,inlinee,&pIStack_f8,(uint)AVar3,(uint)actualCount,returnValueOpnd,
               this_00->m_src1,symCallerThis,local_31[0],fixedFunctionSafeThis,&pIStack_f8);
    Func::SetInlineeStart(inlinee,this_00);
    this_00->m_func = inlinee;
    SetupInlineeFrame(this,inlinee,this_00,actualCount,functionObject);
    pIVar6 = IR::Instr::New(InlineeEnd,inlinee);
    instr = IR::Instr::GetPrevRealInstr(inlinee->m_tailInstr);
    IR::Instr::SetByteCodeOffset(pIVar6,instr);
    newSrc = IR::IntConstOpnd::New((ulong)(actualCount + 3),TyInt32,inlinee,false);
    IR::Instr::SetSrc1(pIVar6,&newSrc->super_Opnd);
    IR::Instr::SetSrc2(pIVar6,this_00->m_dst);
    IR::Instr::InsertBefore(inlinee->m_tailInstr,pIVar6);
    pBVar7 = IR::BranchInstr::New(Br,doneLabel,this_00->m_func);
    IR::Instr::InsertBefore(inlinee->m_tailInstr,&pBVar7->super_Instr);
    IR::Instr::InsertRangeAfter(this_00,inlinee->m_headInstr->m_next,inlinee->m_tailInstr->m_prev);
    IR::Instr::Free(inlinee->m_headInstr);
    IR::Instr::Free(inlinee->m_tailInstr);
    return;
  }
  pBVar7 = IR::BranchInstr::New(Br,doneLabel,callInstr->m_func);
  IR::Instr::InsertBefore(callInstr,&pBVar7->super_Instr);
  return;
}

Assistant:

void Inline::InsertOneInlinee(IR::Instr* callInstr, IR::RegOpnd* returnValueOpnd, IR::Opnd* methodOpnd,
    const FunctionJITTimeInfo * inlineeJITData, const FunctionJITRuntimeInfo * inlineeRuntimeData, IR::LabelInstr* doneLabel, const StackSym* symCallerThis, bool fixedFunctionSafeThis, uint recursiveInlineDepth)
{
    bool isInlined = inlineeJITData->IsInlined();

    IR::Instr* currentCallInstr;
    if (isInlined)
    {
        currentCallInstr = IR::Instr::New(Js::OpCode::InlineeStart, IR::RegOpnd::New(TyVar, callInstr->m_func), methodOpnd, callInstr->m_func);
    }
    else
    {
        currentCallInstr = IR::Instr::New(callInstr->m_opcode, callInstr->m_func);
        currentCallInstr->SetByteCodeOffset(callInstr);
        currentCallInstr->SetSrc1(methodOpnd);
        if (returnValueOpnd)
        {
            currentCallInstr->SetDst(returnValueOpnd);
        }
    }
    currentCallInstr->SetIsCloned(true);
    callInstr->InsertBefore(currentCallInstr);
    this->CloneCallSequence(callInstr, currentCallInstr);

    if (isInlined)
    {
        JITTimeFunctionBody *funcBody = inlineeJITData->GetBody();
        Func *inlinee = BuildInlinee(funcBody, inlineeJITData, inlineeRuntimeData, returnValueOpnd ? returnValueOpnd->m_sym->GetByteCodeRegSlot() : Js::Constants::NoRegister, callInstr, recursiveInlineDepth);

        IR::Instr *argOuts[Js::InlineeCallInfo::MaxInlineeArgoutCount];
#if DBG
        memset(argOuts, 0xFE, sizeof(argOuts));
#endif
        bool stackArgsArgOutExpanded = false;
        Js::ArgSlot actualCount = MapActuals(currentCallInstr, argOuts, Js::InlineeCallInfo::MaxInlineeArgoutCount, inlinee, (Js::ProfileId)callInstr->AsProfiledInstr()->u.profileId, &stackArgsArgOutExpanded);
        Assert(actualCount > 0);
        MapFormals(inlinee, argOuts, funcBody->GetInParamsCount(), actualCount, returnValueOpnd, currentCallInstr->GetSrc1(), symCallerThis, stackArgsArgOutExpanded, fixedFunctionSafeThis, argOuts);
        inlinee->SetInlineeStart(currentCallInstr);
        currentCallInstr->m_func = inlinee;

        // Put the meta arguments that the stack walker expects to find on the stack.
        // As all the argouts are shared among the inlinees, do this only once.
        SetupInlineeFrame(inlinee, currentCallInstr, actualCount, currentCallInstr->GetSrc1());
        
        IR::Instr* inlineeEndInstr = IR::Instr::New(Js::OpCode::InlineeEnd, inlinee);
        inlineeEndInstr->SetByteCodeOffset(inlinee->m_tailInstr->GetPrevRealInstr());
        inlineeEndInstr->SetSrc1(IR::IntConstOpnd::New(actualCount + Js::Constants::InlineeMetaArgCount, TyInt32, inlinee));
        inlineeEndInstr->SetSrc2(currentCallInstr->GetDst());
        inlinee->m_tailInstr->InsertBefore(inlineeEndInstr);

        // JMP to done at the end
        IR::Instr* doneInstr = IR::BranchInstr::New(Js::OpCode::Br, doneLabel, currentCallInstr->m_func);
        inlinee->m_tailInstr->InsertBefore(doneInstr);
        currentCallInstr->InsertRangeAfter(inlinee->m_headInstr->m_next, inlinee->m_tailInstr->m_prev);

        inlinee->m_headInstr->Free();
        inlinee->m_tailInstr->Free();
    }
    else
    {
        callInstr->InsertBefore(IR::BranchInstr::New(Js::OpCode::Br, doneLabel, callInstr->m_func));
    }
}